

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateJSBooleanTest
          (Lowerer *this,RegOpnd *regSrc,Instr *insertInstr,LabelInstr *labelTarget,
          bool fContinueLabel)

{
  LabelInstr *pLVar1;
  bool bVar2;
  IndirOpnd *src1;
  Opnd *src2;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  LabelInstr *local_38;
  
  local_3a = (regSrc->super_Opnd).m_valueType.field_0;
  local_38 = labelTarget;
  bVar2 = ValueType::IsBoolean((ValueType *)&local_3a.field_0);
  pLVar1 = local_38;
  if (bVar2) {
    if (fContinueLabel) {
      InsertBranch(Br,local_38,insertInstr);
      if ((pLVar1->field_0x78 & 2) != 0) {
        local_38->field_0x78 = pLVar1->field_0x78 | 0x20;
      }
    }
  }
  else {
    src1 = IR::IndirOpnd::New(regSrc,0,TyUint64,this->m_func,false);
    src2 = LoadVTableValueOpnd(this,insertInstr,VtableJavascriptBoolean);
    InsertCompare(&src1->super_Opnd,src2,insertInstr);
    if (fContinueLabel) {
      InsertBranch(BrEq_A,local_38,insertInstr);
      InsertLabel(true,insertInstr);
    }
    else {
      InsertBranch(BrNeq_A,local_38,insertInstr);
    }
  }
  return !bVar2;
}

Assistant:

bool Lowerer::GenerateJSBooleanTest(IR::RegOpnd * regSrc, IR::Instr * insertInstr, IR::LabelInstr * labelTarget, bool fContinueLabel)
{
    if (regSrc->GetValueType().IsBoolean())
    {
        if (fContinueLabel)
        {
            // JMP $labelTarget
            InsertBranch(Js::OpCode::Br, labelTarget, insertInstr);
#if DBG
            if (labelTarget->isOpHelper)
            {
                labelTarget->m_noHelperAssert = true;
            }
#endif
        }
        return false;
    }

    IR::IndirOpnd * vtablePtrOpnd = IR::IndirOpnd::New(regSrc, 0, TyMachPtr, this->m_func);
    IR::Opnd * jsBooleanVTable = LoadVTableValueOpnd(insertInstr, VTableValue::VtableJavascriptBoolean);
    InsertCompare(vtablePtrOpnd, jsBooleanVTable, insertInstr);

    if (fContinueLabel)
    {
        // JEQ $labelTarget
        InsertBranch(Js::OpCode::BrEq_A, labelTarget, insertInstr);

        // $helper
        InsertLabel(true, insertInstr);
    }
    else
    {
        // JNE $labelTarget
        InsertBranch(Js::OpCode::BrNeq_A, labelTarget, insertInstr);
    }
    return true;
}